

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O3

bool __thiscall OpenMD::StringTokenizer::nextTokenAsBool(StringTokenizer *this)

{
  istream *piVar1;
  ostream *poVar2;
  bool result;
  string token;
  istringstream iss;
  undefined1 local_1a9;
  string local_1a8;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  nextToken_abi_cxx11_(&local_1a8,this);
  std::__cxx11::istringstream::istringstream(local_188,(string *)&local_1a8,_S_in);
  piVar1 = std::istream::_M_extract<bool>((bool *)local_188);
  if (((&piVar1->field_0x20)[(long)piVar1->_vptr_basic_istream[-3]] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unable to convert ",0x12);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_1a8._M_dataplus._M_p,local_1a8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to a bool",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_1a9 = 0;
  }
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return (bool)local_1a9;
}

Assistant:

bool StringTokenizer::nextTokenAsBool() {
    std::string token = nextToken();
    std::istringstream iss(token);
    bool result;

    if (iss >> result) {
      return result;
    } else {
      std::cerr << "unable to convert " << token << " to a bool" << std::endl;
      return false;
    }
  }